

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X86IntelInstPrinter.c
# Opt level: O1

void printImm(MCInst *MI,SStream *O,int64_t imm,_Bool positive)

{
  uint8_t uVar1;
  int iVar2;
  ulong uVar3;
  undefined7 in_register_00000009;
  ulong uVar4;
  char *fmt;
  
  iVar2 = MI->csh->syntax;
  if ((int)CONCAT71(in_register_00000009,positive) == 0) {
    if (iVar2 == 4) {
      if (-1 < imm) {
        uVar3 = imm;
        if (imm < 10) goto LAB_00240052;
        do {
          uVar4 = uVar3;
          uVar3 = uVar4 >> 4;
        } while (0xf < uVar4);
        goto LAB_00240114;
      }
      uVar3 = imm;
      if (imm < -9) {
        do {
          uVar4 = uVar3;
          uVar3 = uVar4 >> 4;
        } while (0xf < uVar4);
        if (uVar4 < 10) {
          fmt = "-%lxh";
        }
        else {
          fmt = "-0%lxh";
        }
      }
      else {
LAB_002400c8:
        fmt = "-%lu";
      }
    }
    else {
      if (-1 < imm) goto LAB_00240040;
      if (-10 < imm) goto LAB_002400c8;
      fmt = "-0x%lx";
    }
    imm = -imm;
  }
  else {
    if (iVar2 != 4) {
      if (imm < 0) {
        uVar1 = MI->op1_size;
        if (uVar1 == '\x04') {
          imm = imm & 0xffffffff;
        }
        else if (uVar1 == '\x02') {
          imm = imm & 0xffff;
        }
        else if (uVar1 == '\x01') {
          imm = imm & 0xff;
        }
      }
      else {
LAB_00240040:
        if (imm < 10) goto LAB_00240052;
      }
      fmt = "0x%lx";
      goto LAB_0024012d;
    }
    if (imm < 0) {
      uVar1 = MI->op1_size;
      if (uVar1 == '\x04') {
        imm = imm & 0xffffffff;
        uVar3 = imm;
      }
      else if (uVar1 == '\x02') {
        imm = imm & 0xffff;
        uVar3 = imm;
      }
      else {
        uVar3 = imm;
        if (uVar1 == '\x01') {
          imm = imm & 0xff;
          uVar3 = imm;
        }
      }
      do {
        uVar4 = uVar3;
        uVar3 = uVar4 >> 4;
      } while (0xf < uVar4);
    }
    else {
      uVar3 = imm;
      if (imm < 10) {
LAB_00240052:
        fmt = "%lu";
        goto LAB_0024012d;
      }
      do {
        uVar4 = uVar3;
        uVar3 = uVar4 >> 4;
      } while (0xf < uVar4);
    }
LAB_00240114:
    if (uVar4 < 10) {
      fmt = "%lxh";
    }
    else {
      fmt = "0%lxh";
    }
  }
LAB_0024012d:
  SStream_concat(O,fmt,imm);
  return;
}

Assistant:

static void printImm(MCInst *MI, SStream *O, int64_t imm, bool positive)
{
	if (positive) {
		// always print this number in positive form
		if (MI->csh->syntax == CS_OPT_SYNTAX_MASM) {
			if (imm < 0) {
				if (MI->op1_size) {
					switch(MI->op1_size) {
						default:
							break;
						case 1:
							imm &= 0xff;
							break;
						case 2:
							imm &= 0xffff;
							break;
						case 4:
							imm &= 0xffffffff;
							break;
					}
				}

				if (imm == 0x8000000000000000LL)  // imm == -imm
					SStream_concat0(O, "8000000000000000h");
				else if (need_zero_prefix(imm))
					SStream_concat(O, "0%"PRIx64"h", imm);
				else
					SStream_concat(O, "%"PRIx64"h", imm);
			} else {
				if (imm > HEX_THRESHOLD) {
					if (need_zero_prefix(imm))
						SStream_concat(O, "0%"PRIx64"h", imm);
					else
						SStream_concat(O, "%"PRIx64"h", imm);
				} else
					SStream_concat(O, "%"PRIu64, imm);
			}
		} else {	// Intel syntax
			if (imm < 0) {
				if (MI->op1_size) {
					switch(MI->op1_size) {
						default:
							break;
						case 1:
							imm &= 0xff;
							break;
						case 2:
							imm &= 0xffff;
							break;
						case 4:
							imm &= 0xffffffff;
							break;
					}
				}

				SStream_concat(O, "0x%"PRIx64, imm);
			} else {
				if (imm > HEX_THRESHOLD)
					SStream_concat(O, "0x%"PRIx64, imm);
				else
					SStream_concat(O, "%"PRIu64, imm);
			}
		}
	} else {
		if (MI->csh->syntax == CS_OPT_SYNTAX_MASM) {
			if (imm < 0) {
				if (imm == 0x8000000000000000LL)  // imm == -imm
					SStream_concat0(O, "8000000000000000h");
				else if (imm < -HEX_THRESHOLD) {
					if (need_zero_prefix(imm))
						SStream_concat(O, "-0%"PRIx64"h", -imm);
					else
						SStream_concat(O, "-%"PRIx64"h", -imm);
				} else
					SStream_concat(O, "-%"PRIu64, -imm);
			} else {
				if (imm > HEX_THRESHOLD) {
					if (need_zero_prefix(imm))
						SStream_concat(O, "0%"PRIx64"h", imm);
					else
						SStream_concat(O, "%"PRIx64"h", imm);
				} else
					SStream_concat(O, "%"PRIu64, imm);
			}
		} else {	// Intel syntax
			if (imm < 0) {
				if (imm == 0x8000000000000000LL)  // imm == -imm
					SStream_concat0(O, "0x8000000000000000");
				else if (imm < -HEX_THRESHOLD)
					SStream_concat(O, "-0x%"PRIx64, -imm);
				else
					SStream_concat(O, "-%"PRIu64, -imm);

			} else {
				if (imm > HEX_THRESHOLD)
					SStream_concat(O, "0x%"PRIx64, imm);
				else
					SStream_concat(O, "%"PRIu64, imm);
			}
		}
	}
}